

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagebox.cpp
# Opt level: O1

void Cmd_menu_quit(FCommandLine *argv,APlayerPawn *who,int key)

{
  DMenu *menu;
  
  M_StartControlPanel(true);
  menu = (DMenu *)M_Malloc_Dbg(0x50,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/./dobject.h"
                               ,0x1f9);
  DQuitMenu::DQuitMenu((DQuitMenu *)menu,false);
  (menu->mParentMenu).field_0.p = DMenu::CurrentMenu;
  M_ActivateMenu(menu);
  return;
}

Assistant:

CCMD (menu_quit)
{	// F10
	M_StartControlPanel (true);
	DMenu *newmenu = new DQuitMenu(false);
	newmenu->mParentMenu = DMenu::CurrentMenu;
	M_ActivateMenu(newmenu);
}